

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,wchar_t **it)

{
  undefined2 uVar1;
  int iVar2;
  wchar_t *__dest;
  bool bVar3;
  long lVar4;
  undefined1 *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  undefined1 uVar11;
  undefined1 auVar10 [16];
  undefined1 auStack_b8 [160];
  
  uVar7 = *(ulong *)this;
  iVar2 = *(int *)(this + 8);
  lVar9 = (long)iVar2;
  puVar5 = auStack_b8 + lVar9 * 4;
  uVar8 = uVar7;
  if (99 < uVar7) {
    do {
      uVar7 = uVar8 / 100;
      uVar1 = *(undefined2 *)
               (basic_data<void>::digits + (ulong)(uint)((int)uVar8 + (int)uVar7 * -100) * 2);
      uVar11 = (undefined1)((ushort)uVar1 >> 8);
      auVar10 = ZEXT416(CONCAT22((short)(CONCAT13(uVar11,CONCAT12(uVar11,uVar1)) >> 0x10),
                                 CONCAT11((char)uVar1,(char)uVar1)));
      auVar10 = pshuflw(auVar10,auVar10,0x60);
      *(ulong *)(puVar5 + -8) = CONCAT44(auVar10._4_4_ >> 0x18,auVar10._0_4_ >> 0x18);
      puVar5 = puVar5 + -8;
      bVar3 = 9999 < uVar8;
      uVar8 = uVar7;
    } while (bVar3);
  }
  __dest = *it;
  if (uVar7 < 10) {
    uVar6 = (uint)uVar7 | 0x30;
    lVar4 = -4;
  }
  else {
    *(int *)(puVar5 + -4) =
         (int)(char)basic_data<void>::digits[((uVar7 & 0xffffffff) * 2 & 0xffffffff) + 1];
    uVar6 = (uint)(char)basic_data<void>::digits[(uVar7 & 0xffffffff) * 2];
    lVar4 = -8;
  }
  *(uint *)(puVar5 + lVar4) = uVar6;
  if (iVar2 != 0) {
    memcpy(__dest,auStack_b8,lVar9 * 4);
  }
  *it = __dest + lVar9;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }